

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O0

uint16 crnlib::etc1_block::pack_color5(uint r,uint g,uint b,bool scaled,uint bias)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  byte in_CL;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  int in_R8D;
  undefined4 local_c;
  undefined4 local_8;
  undefined4 local_4;
  
  local_c = in_EDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  if ((in_CL & 1) != 0) {
    local_4 = (in_EDI * 0x1f + in_R8D) / 0xff;
    local_8 = (in_ESI * 0x1f + in_R8D) / 0xff;
    local_c = (in_EDX * 0x1f + in_R8D) / 0xff;
  }
  uVar1 = math::minimum<unsigned_int>(local_4,0x1f);
  uVar2 = math::minimum<unsigned_int>(local_8,0x1f);
  uVar3 = math::minimum<unsigned_int>(local_c,0x1f);
  return (ushort)uVar3 | (ushort)(uVar2 << 5) | (ushort)(uVar1 << 10);
}

Assistant:

uint16 etc1_block::pack_color5(uint r, uint g, uint b, bool scaled, uint bias) {
  if (scaled) {
    r = (r * 31U + bias) / 255U;
    g = (g * 31U + bias) / 255U;
    b = (b * 31U + bias) / 255U;
  }

  r = math::minimum(r, 31U);
  g = math::minimum(g, 31U);
  b = math::minimum(b, 31U);

  return static_cast<uint16>(b | (g << 5U) | (r << 10U));
}